

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

_List_iterator<State> __thiscall
QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::value
          (QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *this,
          _List_iterator<QString> *key,_List_iterator<State> *defaultValue)

{
  QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>
  *pQVar1;
  const_iterator cVar2;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>
                 *)0x0) {
    cVar2 = std::
            _Rb_tree<std::_List_iterator<QString>,_std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>,_std::_Select1st<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>
            ::find(&(pQVar1->m)._M_t,key);
    if ((_Rb_tree_header *)cVar2._M_node !=
        &(((this->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
      defaultValue = (_List_iterator<State> *)&cVar2._M_node[1]._M_parent;
    }
  }
  return (_List_iterator<State>)(_List_node_base *)*(_Base_ptr *)defaultValue;
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }